

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateSectionForceTorque
          (ChElementBeamTaperedTimoshenko *this,double eta,ChVector<double> *Fforce,
          ChVector<double> *Mtorque)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar9;
  double *pdVar10;
  Index row;
  long lVar11;
  char *pcVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVectorDynamic<> displ_ec;
  ChVectorDynamic<> displ;
  ChMatrixDynamic<> Teta;
  ChVectorN<double,_2> qerx;
  ChVectorN<double,_2> qeux;
  ChMatrixNM<double,_6,_6> Klaw_d;
  ChVectorN<double,_4> qez;
  ChVectorN<double,_4> qey;
  ChVectorN<double,_6> wrench;
  ShapeFunctionGroup NN;
  ChMatrixNM<double,_6,_6> Klaw_r;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_9d0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_9c0;
  double local_9b0;
  double local_9a8;
  double local_9a0;
  double local_998;
  double local_990;
  double dStack_988;
  undefined1 local_980 [16];
  Index local_970;
  double local_960;
  double dStack_958;
  double dStack_950;
  double dStack_948;
  double local_940;
  double dStack_938;
  double dStack_930;
  double dStack_928;
  double local_920;
  double dStack_918;
  double dStack_910;
  double dStack_908;
  double local_900;
  undefined8 uStack_8f8;
  double local_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [24];
  double dStack_8c8;
  Matrix<double,_6,_6,_1,_6,_6> local_8c0;
  double local_7a0;
  double dStack_798;
  double dStack_790;
  double dStack_788;
  Matrix<double,_4,_1,_0,_4,_1> *local_780;
  double dStack_778;
  double dStack_770;
  double dStack_768;
  double local_760;
  double dStack_758;
  double dStack_750;
  double dStack_748;
  double local_740;
  double dStack_738;
  double dStack_730;
  double dStack_728;
  double local_720;
  double dStack_718;
  double dStack_710;
  double dStack_708;
  Matrix<double,_4,_1,_0,_4,_1> local_700;
  Matrix<double,_4,_1,_0,_4,_1> local_6e0;
  assign_op<double,_double> local_6b0 [24];
  Matrix<double,__1,__1,_1,__1,__1> local_698;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
  local_678;
  assign_op<double,_double> *local_660;
  undefined8 local_658;
  undefined8 local_648;
  ShapeFunctionGroup local_640;
  Matrix<double,_6,_6,_1,_6,_6> local_240;
  
  local_998 = eta;
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x50a,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateSectionForceTorque(const double, ChVector<> &, ChVector<> &)"
                 );
  }
  iVar8 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])();
  local_9c0.m_storage.m_data = (double *)0x0;
  local_9c0.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_9c0,(long)iVar8);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_9c0);
  if ((this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols !=
      local_9c0.m_storage.m_rows) {
    pcVar12 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
LAB_0068866a:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar12);
  }
  local_9d0.m_storage.m_data = (double *)0x0;
  local_9d0.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_9d0,
             (this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows,1);
  lVar11 = (this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if (local_9d0.m_storage.m_rows != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_9d0,lVar11,1);
  }
  if (local_9d0.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_9d0.m_storage.m_rows != 0) {
    memset(local_9d0.m_storage.m_data,0,local_9d0.m_storage.m_rows << 3);
  }
  local_640.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
  ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_9d0,&this->T,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_9c0,(Scalar *)&local_640);
  if (local_9d0.m_storage.m_rows < 2) {
LAB_006885ab:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  local_640.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
       (double)&local_6e0;
  local_640.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] = 0.0;
  local_640.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_640.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
  .
  super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
  ._M_head_impl.
  super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
  .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
  super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_9d0.m_storage.m_data[1];
  if (((local_9d0.m_storage.m_rows < 6) ||
      (pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_640,
                           local_9d0.m_storage.m_data + 5), local_9d0.m_storage.m_rows < 8)) ||
     (pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                         (pCVar9,local_9d0.m_storage.m_data + 7), local_9d0.m_storage.m_rows < 0xc))
  goto LAB_006885ab;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (pCVar9,local_9d0.m_storage.m_data + 0xb);
  if (((long)local_640.
             super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
             .
             super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
             .
             super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
             .
             super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
             .
             super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
             .
             super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
             ._M_head_impl.
             super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
             .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
             super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
             super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3]
       + (long)local_640.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
               .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
               super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1] == 4) &&
     (local_640.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
      ._M_head_impl.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
      .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
      super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
      super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] ==
      4.94065645841247e-324)) {
    if (local_9d0.m_storage.m_rows < 3) goto LAB_006885ab;
    local_640.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
    ._M_head_impl.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
    .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
    super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
    super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
         (double)&local_700;
    local_640.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
    ._M_head_impl.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
    .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
    super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
    super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] = 0.0;
    local_640.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
    ._M_head_impl.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
    .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
    super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
    super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
         4.94065645841247e-324;
    local_640.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
    .
    super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
    ._M_head_impl.
    super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
    .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
    super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
    super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
         4.94065645841247e-324;
    local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
         = local_9d0.m_storage.m_data[2];
    if (((local_9d0.m_storage.m_rows < 5) ||
        (pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_640,
                             local_9d0.m_storage.m_data + 4), local_9d0.m_storage.m_rows < 9)) ||
       (pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                           (pCVar9,local_9d0.m_storage.m_data + 8), local_9d0.m_storage.m_rows < 0xb
       )) goto LAB_006885ab;
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
              (pCVar9,local_9d0.m_storage.m_data + 10);
    if (((long)local_640.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
               .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
               super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [3] +
         (long)local_640.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
               .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
               super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1] == 4) &&
       (local_640.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
        ._M_head_impl.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
        .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
        super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
        super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] ==
        4.94065645841247e-324)) {
      if (local_9d0.m_storage.m_rows < 1) goto LAB_006885ab;
      local_640.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
      ._M_head_impl.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
      .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
      super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
      super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
           (double)(local_8e0 + 0x10);
      local_640.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
      ._M_head_impl.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
      .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
      super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
      super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] = 0.0;
      local_640.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
      ._M_head_impl.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
      .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
      super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
      super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
           4.94065645841247e-324;
      local_640.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
      .
      super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
      ._M_head_impl.
      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
      .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
      super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
      super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
           4.94065645841247e-324;
      local_8e0._16_8_ = *local_9d0.m_storage.m_data;
      if (local_9d0.m_storage.m_rows < 7) goto LAB_006885ab;
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_640,
                 local_9d0.m_storage.m_data + 6);
      if (((long)local_640.
                 super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                 ._M_head_impl.
                 super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                 .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                 super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
                 [3] +
           (long)local_640.
                 super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                 .
                 super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                 ._M_head_impl.
                 super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                 .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                 super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
                 super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
                 [1] == 2) &&
         (local_640.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
          .
          super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
          .
          super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
          .
          super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
          .
          super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
          .
          super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
          ._M_head_impl.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
          .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
          super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] ==
          4.94065645841247e-324)) {
        if (local_9d0.m_storage.m_rows < 4) goto LAB_006885ab;
        local_640.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
        ._M_head_impl.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
        .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
        super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
        super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0] =
             (double)local_8e0;
        local_640.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
        ._M_head_impl.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
        .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
        super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
        super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[1] = 0.0
        ;
        local_640.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
        ._M_head_impl.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
        .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
        super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
        super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2] =
             4.94065645841247e-324;
        local_640.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
        .
        super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
        ._M_head_impl.
        super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
        .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
        super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
        super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[3] =
             4.94065645841247e-324;
        local_8e0._0_8_ = local_9d0.m_storage.m_data[3];
        if (local_9d0.m_storage.m_rows < 10) goto LAB_006885ab;
        Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_640,
                   local_9d0.m_storage.m_data + 9);
        if (((long)local_640.
                   super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                   ._M_head_impl.
                   super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                   .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                   super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.
                   array[3] +
             (long)local_640.
                   super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                   .
                   super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                   ._M_head_impl.
                   super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                   .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                   super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
                   super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.
                   array[1] == 2) &&
           (local_640.
            super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
            .
            super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
            .
            super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
            .
            super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
            .
            super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
            .
            super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
            ._M_head_impl.
            super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
            .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
            super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
            super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[2]
            == 4.94065645841247e-324)) {
          ShapeFunctionsTimoshenko(this,&local_640,local_998);
          local_990 = local_640.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                      ._M_head_impl.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .
                      super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .
                      super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .
                      super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                      super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false>.
                      _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                      m_storage.m_data.array[0];
          dStack_988 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data.array[1];
          local_960 = local_640.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                      ._M_head_impl.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .
                      super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .
                      super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .
                      super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                      _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      m_storage.m_data.array[0];
          dStack_958 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[1];
          dStack_950 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[2];
          dStack_948 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[3];
          local_940 = local_640.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                      ._M_head_impl.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .
                      super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                      .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                      _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      m_storage.m_data.array[0];
          dStack_938 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[1];
          dStack_930 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[2];
          dStack_928 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .
                       super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                       .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[3];
          local_780 = (Matrix<double,_4,_1,_0,_4,_1> *)
                      local_640.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                      ._M_head_impl.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                      .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                      _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      m_storage.m_data.array[0];
          dStack_778 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[1];
          dStack_770 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[2];
          dStack_768 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[3];
          local_7a0 = local_640.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                      ._M_head_impl.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                      .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                      _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      m_storage.m_data.array[0];
          dStack_798 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[1];
          dStack_790 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[2];
          dStack_788 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<4UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[3];
          local_740 = local_640.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                      ._M_head_impl.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                      .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                      _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      m_storage.m_data.array[0];
          dStack_738 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[1];
          dStack_730 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[2];
          dStack_728 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[3];
          local_720 = local_640.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                      .
                      super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                      ._M_head_impl.
                      super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                      .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                      _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                      m_storage.m_data.array[0];
          dStack_718 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[1];
          dStack_710 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[2];
          dStack_708 = local_640.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Tuple_impl<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                       .
                       super__Head_base<3UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_false>
                       ._M_head_impl.
                       super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>
                       .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>.
                       _M_head_impl.super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.
                       m_storage.m_data.array[3];
          (*((this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_8c0);
          local_9a0 = *(double *)
                       ((long)local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                              .m_storage.m_data.array[0] + 0xa8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[1]);
          }
          (*((this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_8c0);
          local_9a8 = *(double *)
                       ((long)local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                              .m_storage.m_data.array[0] + 0xb0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[1]);
          }
          (*((this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_8c0);
          local_8f0 = *(double *)
                       ((long)local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                              .m_storage.m_data.array[0] + 0xb8);
          uStack_8e8 = 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[1]);
          }
          (*((this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_8c0);
          local_900 = *(double *)
                       ((long)local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                              .m_storage.m_data.array[0] + 0xc0);
          uStack_8f8 = 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[1]);
          }
          (*((this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_8c0);
          local_9b0 = *(double *)
                       ((long)local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                              .m_storage.m_data.array[0] + 200);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[1]);
          }
          (*((this->tapered_section).
             super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(&local_8c0);
          local_920 = *(double *)
                       ((long)local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                              .m_storage.m_data.array[0] + 0xd0);
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x23] = local_920;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
              m_data.array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[1]);
            local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array[0x23] = local_920;
          }
          auVar15._8_8_ = 0x7fffffffffffffff;
          auVar15._0_8_ = 0x7fffffffffffffff;
          auVar2._8_8_ = uStack_8e8;
          auVar2._0_8_ = local_8f0;
          auVar2 = vandpd_avx(auVar2,auVar15);
          dVar13 = local_990 * (double)local_8e0._16_8_;
          dStack_8c8 = dStack_988 * dStack_8c8;
          auVar5._8_8_ = uStack_8f8;
          auVar5._0_8_ = local_900;
          local_920 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array[0];
          dStack_918 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[1];
          dStack_910 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[2];
          dStack_908 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[3];
          local_760 = local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array[0];
          dStack_758 = local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[1];
          dStack_750 = local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[2];
          dStack_748 = local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                       m_storage.m_data.array[3];
          if ((auVar2._0_8_ < 0.001) || (auVar2 = vandpd_avx(auVar5,auVar15), auVar2._0_8_ < 0.001))
          {
            auVar3._8_8_ = dStack_798;
            auVar3._0_8_ = local_7a0;
            auVar3._16_8_ = dStack_790;
            auVar3._24_8_ = dStack_788;
            auVar3 = vsubpd_avx(ZEXT832(0) << 0x40,auVar3);
            dStack_938 = auVar3._0_8_ *
                         local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[0] +
                         auVar3._16_8_ *
                         local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[2] +
                         auVar3._8_8_ *
                         local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[1] +
                         auVar3._24_8_ *
                         local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[3];
            auVar6._8_8_ = dStack_778;
            auVar6._0_8_ = local_780;
            auVar6._16_8_ = dStack_770;
            auVar6._24_8_ = dStack_768;
            auVar3 = vsubpd_avx(ZEXT832(0) << 0x40,auVar6);
            dStack_958 = auVar3._0_8_ *
                         local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[0] +
                         auVar3._16_8_ *
                         local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[2];
            dVar14 = auVar3._8_8_ *
                     local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[1] +
                     auVar3._24_8_ *
                     local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[3];
            local_960 = dStack_958 + dVar14;
            dStack_958 = dStack_958 + dVar14;
            local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array[0xe] = local_9b0;
            local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array[7] = local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[0x23];
          }
          else {
            dStack_938 = local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[0] * local_940 +
                         local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[2] * dStack_930 +
                         local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[1] * dStack_938 +
                         local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[3] * dStack_928;
            dVar14 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[0] * local_960 +
                     local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[2] * dStack_950;
            dStack_958 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[1] * dStack_958 +
                         local_700.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                         m_storage.m_data.array[3] * dStack_948;
            local_960 = dVar14 + dStack_958;
            dStack_958 = dVar14 + dStack_958;
            local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array[0xe] = local_900;
            local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
            array[7] = local_8f0;
          }
          local_990 = local_990 * (double)local_8e0._0_8_;
          dStack_988 = dStack_988 * (double)local_8e0._8_8_;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[1] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[2] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[3] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[4] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[5] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[6] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x20] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x21] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x22] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x18] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x19] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1a] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1b] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1d] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1e] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1f] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[8] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[9] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[10] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0] = local_9a0;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x15] = local_9a8;
          local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1c] = local_9b0;
          local_980 = ZEXT816(0) << 0x20;
          local_970 = 0;
          local_940 = dVar13 + dStack_8c8;
          ComputeTransformMatrixAtPoint(this,(ChMatrixDynamic<> *)local_980,local_998);
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x20] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x21] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x22] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x23] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x18] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x19] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1a] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1b] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1c] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1d] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1e] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x1f] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[8] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[9] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[10] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[0] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[1] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[2] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[3] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[4] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[5] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[6] = 0.0;
          local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
          array[7] = 0.0;
          if (local_980._8_8_ == 6) {
            local_678.m_lhs.m_matrix = (ChMatrixDynamic<> *)local_980;
            local_678.m_rhs = &local_8c0;
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::internal::assign_op<double,double>>
                      (&local_240,&local_678,local_6b0,(type)0x0);
            auVar7._8_8_ = dStack_738;
            auVar7._0_8_ = local_740;
            auVar7._16_8_ = dStack_730;
            auVar7._24_8_ = dStack_728;
            auVar3 = vsubpd_avx(ZEXT832(0) << 0x40,auVar7);
            auVar16._0_8_ = local_990 + dStack_988;
            auVar16._8_8_ = local_990 + dStack_988;
            auVar4._8_8_ = dStack_958;
            auVar4._0_8_ = local_960;
            auVar2 = vunpcklpd_avx(auVar4,auVar16);
            pdVar10 = local_240.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array + 4;
            lVar11 = 0;
            do {
              dVar13 = local_940 * ((plain_array<double,_36,_1,_32> *)(pdVar10 + -4))->array[0] +
                       auVar2._0_8_ * pdVar10[-2] +
                       (auVar3._0_8_ * local_920 + auVar3._16_8_ * dStack_910 +
                       auVar3._8_8_ * dStack_918 + auVar3._24_8_ * dStack_908) * *pdVar10;
              dVar14 = dStack_938 * pdVar10[-3] +
                       auVar2._8_8_ * pdVar10[-1] +
                       (local_760 * local_720 + dStack_750 * dStack_710 +
                       dStack_758 * dStack_718 + dStack_748 * dStack_708) * pdVar10[1];
              auVar17._0_8_ = dVar13 + dVar14;
              auVar17._8_8_ = dVar13 + dVar14;
              uVar1 = vmovlpd_avx(auVar17);
              *(undefined8 *)(local_6b0 + lVar11 * 8) = uVar1;
              lVar11 = lVar11 + 1;
              pdVar10 = pdVar10 + 6;
            } while (lVar11 != 6);
            local_678.m_rhs = (RhsNested)0x3;
            local_658 = 0;
            local_648 = 6;
            local_678.m_lhs.m_matrix = (non_const_type)local_6b0;
            local_660 = local_6b0;
            ChVector<double>::operator=
                      (Fforce,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                               *)&local_678);
            local_678.m_lhs.m_matrix = &local_698;
            local_678.m_rhs = (RhsNested)0x3;
            local_658 = 3;
            local_648 = 6;
            local_660 = local_6b0;
            ChVector<double>::operator=
                      (Mtorque,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                *)&local_678);
            if ((double *)local_980._0_8_ != (double *)0x0) {
              free(*(void **)(local_980._0_8_ + -8));
            }
            if (local_9d0.m_storage.m_data != (double *)0x0) {
              free((void *)local_9d0.m_storage.m_data[-1]);
            }
            if (local_9c0.m_storage.m_data != (double *)0x0) {
              free((void *)local_9c0.m_storage.m_data[-1]);
            }
            return;
          }
          pcVar12 = 
          "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 6, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 6, 6, 1>, Option = 0]"
          ;
          goto LAB_0068866a;
        }
      }
      pcVar12 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
      ;
      goto LAB_006885f6;
    }
  }
  pcVar12 = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
  ;
LAB_006885f6:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar12);
}

Assistant:

void ChElementBeamTaperedTimoshenko::EvaluateSectionForceTorque(const double eta,
                                                                ChVector<>& Fforce,
                                                                ChVector<>& Mtorque) {
    assert(tapered_section);

    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);

    ChVectorDynamic<> displ_ec = this->T * displ;  // transform the displacement of two nodes to elastic axis

    ChVectorN<double, 4> qey;
    qey << displ_ec(1), displ_ec(5), displ_ec(7), displ_ec(11);
    ChVectorN<double, 4> qez;
    qez << displ_ec(2), displ_ec(4), displ_ec(8), displ_ec(10);
    ChVectorN<double, 2> qeux;
    qeux << displ_ec(0), displ_ec(6);
    ChVectorN<double, 2> qerx;
    qerx << displ_ec(3), displ_ec(9);

    ShapeFunctionGroup NN;
    ShapeFunctionsTimoshenko(NN, eta);
    ShapeFunction5Blocks sfblk1d = std::get<2>(NN);
    ShapeFunction2Blocks sfblk2d = std::get<3>(NN);
    ShapeFunction2Blocks sfblk3d = std::get<4>(NN);
    auto dkNx1 = std::get<4>(sfblk1d);
    auto dkNsy = std::get<1>(sfblk1d);
    auto dkNsz = std::get<3>(sfblk1d);
    auto ddkNby = std::get<0>(sfblk2d);
    auto ddkNbz = std::get<1>(sfblk2d);
    auto dddkNby = std::get<0>(sfblk3d);
    auto dddkNbz = std::get<1>(sfblk3d);

    double EA = this->tapered_section->GetAverageSectionParameters()->EA;
    double GJ = this->tapered_section->GetAverageSectionParameters()->GJ;
    double GAyy = this->tapered_section->GetAverageSectionParameters()->GAyy;
    double GAzz = this->tapered_section->GetAverageSectionParameters()->GAzz;
    double EIyy = this->tapered_section->GetAverageSectionParameters()->EIyy;
    double EIzz = this->tapered_section->GetAverageSectionParameters()->EIzz;

    double eps = 1.0e-3;
    bool use_shear_stain = true;  // As default, use shear strain to evaluate the shear forces
    if (abs(GAyy) < eps ||
        abs(GAzz) < eps) {  // Sometimes, the user will not input GAyy, GAzz, so GAyy, GAzz may be zero.
        use_shear_stain = false;
    }

    // generalized strains/curvatures;
    ChVectorN<double, 6> sect_ek;
    sect_ek(0) = dkNx1 * qeux;   // ux
    sect_ek(3) = dkNx1 * qerx;   // rotx
    sect_ek(4) = -ddkNbz * qez;  // roty
    sect_ek(5) = ddkNby * qey;   // rotz

    if (use_shear_stain) {
        // Strictly speaking, dkNsy * qey,dkNsz * qez are the real shear strains.
        sect_ek(1) = dkNsy * qey;  // gamma_y = dkNsy * qey; Fy = GAyy * gamma_y;
        sect_ek(2) = dkNsz * qez;  // gamma_z = dkNsz * qez; Fz = GAzz * gamma_z;
    } else {
        // Calculate the shear strain through third-differentian of bending displacement
        sect_ek(1) = -dddkNby * qey;  // Fy == -EIzz * dddkNby * qey == GAyy * dkNsy * qey;
        sect_ek(2) = -dddkNbz * qez;  // Fz == -EIyy *  dddkNbz * qez == GAzz * dkNsz * qez;
    }

    if (false)  // section->alpha ==0 && section->Cy ==0 && section->Cz==0 && section->Sy==0 && section->Sz==0)
    {
        // Fast computation:
        Fforce.x() = EA * sect_ek(0);
        if (use_shear_stain) {
            Fforce.y() = GAyy * sect_ek(1);
            Fforce.z() = GAzz * sect_ek(2);
        } else {
            Fforce.y() = EIzz * sect_ek(1);
            Fforce.z() = EIyy * sect_ek(2);
        }

        Mtorque.x() = GJ * sect_ek(3);
        Mtorque.y() = EIyy * sect_ek(4);
        Mtorque.z() = EIzz * sect_ek(5);
    } else {
        // Constitutive matrix of the beam:
        ChMatrixNM<double, 6, 6> Klaw_d;
        Klaw_d.setZero();
        Klaw_d(0, 0) = EA;
        Klaw_d(3, 3) = GJ;
        Klaw_d(4, 4) = EIyy;
        Klaw_d(5, 5) = EIzz;

        if (use_shear_stain) {
            Klaw_d(1, 1) = GAyy;
            Klaw_d(2, 2) = GAzz;
        } else {
            Klaw_d(1, 1) = EIzz;
            Klaw_d(2, 2) = EIyy;
        }

        ChMatrixDynamic<> Teta;
        ComputeTransformMatrixAtPoint(Teta, eta);

        // ..unrolled rotated constitutive matrix..
        ChMatrixNM<double, 6, 6> Klaw_r;
        Klaw_r.setZero();
        Klaw_r = Teta.transpose() * Klaw_d;

        // .. compute wrench = Klaw_r * sect_ek
        ChVectorN<double, 6> wrench = Klaw_r * sect_ek;
        Fforce = wrench.segment(0, 3);
        Mtorque = wrench.segment(3, 3);
    }
}